

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

int portability_path_separator_normalize_inplace(char *path,size_t size)

{
  char cVar1;
  size_t sVar2;
  
  if (path != (char *)0x0) {
    if (size != 0) {
      cVar1 = '\0';
      sVar2 = 0;
      do {
        if ((path[sVar2] == '\\') || (path[sVar2] == '/')) {
          if (cVar1 == '\0') {
            cVar1 = '/';
          }
          else {
            path[sVar2] = cVar1;
          }
        }
        sVar2 = sVar2 + 1;
      } while (size != sVar2);
    }
    return 0;
  }
  return 1;
}

Assistant:

int portability_path_separator_normalize_inplace(char *path, size_t size)
{
	if (path == NULL)
	{
		return 1;
	}

	size_t iterator;
	char separator = 0;

	for (iterator = 0; iterator < size; ++iterator)
	{
		if (PORTABILITY_PATH_SEPARATOR_ALL(path[iterator]))
		{
			if (separator == 0)
			{
				separator = PORTABILITY_PATH_SEPARATOR_C; /* Use current platform style as default */
			}
			else
			{
				path[iterator] = separator;
			}
		}
	}

	return 0;
}